

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_functions.cc
# Opt level: O2

uint32_t hash_djb2_last8(uint8_t *value,int len)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  
  iVar1 = 8;
  if (len < 8) {
    iVar1 = len;
  }
  uVar2 = 0x1505;
  for (lVar3 = 0; -lVar3 != (long)iVar1; lVar3 = lVar3 + -1) {
    uVar2 = (uint)value[lVar3 + (long)len + -1] + uVar2 * 0x21;
  }
  return uVar2;
}

Assistant:

uint32_t hash_djb2_last8(uint8_t *value, int len)
{
    int min = MIN(len, 8), c;
    unsigned hash = 5381;
    c = min;
    while(c--){
        hash = ((hash << 5) + hash) + *((uint8_t*)value + (len - min) + c);
    }
    return hash;
}